

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O0

Formula * Kernel::Formula::createLet
                    (uint predicate,VList *variables,Formula *body,Formula *contents)

{
  TermList TVar1;
  Formula *pFVar2;
  undefined4 in_EDI;
  TermList letTerm;
  TermList contentsTerm;
  TermList bodyTerm;
  Term *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  Formula *in_stack_ffffffffffffff90;
  VList *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  uint functor;
  undefined8 local_30;
  undefined8 local_28;
  
  functor = (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  Term::createFormula(in_stack_ffffffffffffff90);
  TermList::TermList((TermList *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
  Term::createFormula(in_stack_ffffffffffffff90);
  TermList::TermList((TermList *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
  TVar1 = AtomicSort::boolSort();
  Term::createLet(functor,in_stack_ffffffffffffffa0,local_28,local_30,TVar1);
  TermList::TermList((TermList *)CONCAT44(in_EDI,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
  pFVar2 = (Formula *)BoolTermFormula::operator_new(0x857332);
  TVar1._content._4_4_ = in_EDI;
  TVar1._content._0_4_ = in_stack_ffffffffffffff80;
  BoolTermFormula::BoolTermFormula((BoolTermFormula *)in_stack_ffffffffffffff78,TVar1);
  return pFVar2;
}

Assistant:

Formula* Formula::createLet(unsigned predicate, VList* variables, Formula* body, Formula* contents)
{
  TermList bodyTerm(Term::createFormula(body));
  TermList contentsTerm(Term::createFormula(contents));
  TermList letTerm(Term::createLet(predicate, variables, bodyTerm, contentsTerm, AtomicSort::boolSort()));
  return new BoolTermFormula(letTerm);
}